

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::SuspendIdleDecommitNonLeaf(HeapInfo *this)

{
  HeapInfo *this_local;
  
  ForEachNonLeafPageAllocator<Memory::HeapInfo::SuspendIdleDecommitNonLeaf()::__0>(this);
  return;
}

Assistant:

void
HeapInfo::SuspendIdleDecommitNonLeaf()
{
    ForEachNonLeafPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->SuspendIdleDecommit();
    });
}